

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall
editor::GraphicDocument::remove_primitive_from_document
          (GraphicDocument *this,shared_ptr<editor::figures::CanvasPrimitive> *primitive)

{
  bool bVar1;
  ostream *poVar2;
  element_type *peVar3;
  const_iterator local_70;
  string local_58 [32];
  __normal_iterator<std::shared_ptr<editor::figures::CanvasPrimitive>_*,_std::vector<std::shared_ptr<editor::figures::CanvasPrimitive>,_std::allocator<std::shared_ptr<editor::figures::CanvasPrimitive>_>_>_>
  local_38;
  shared_ptr<editor::figures::CanvasPrimitive> *local_30;
  __normal_iterator<std::shared_ptr<editor::figures::CanvasPrimitive>_*,_std::vector<std::shared_ptr<editor::figures::CanvasPrimitive>,_std::allocator<std::shared_ptr<editor::figures::CanvasPrimitive>_>_>_>
  local_28;
  __normal_iterator<std::shared_ptr<editor::figures::CanvasPrimitive>_*,_std::vector<std::shared_ptr<editor::figures::CanvasPrimitive>,_std::allocator<std::shared_ptr<editor::figures::CanvasPrimitive>_>_>_>
  local_20;
  __normal_iterator<std::shared_ptr<editor::figures::CanvasPrimitive>_*,_std::vector<std::shared_ptr<editor::figures::CanvasPrimitive>,_std::allocator<std::shared_ptr<editor::figures::CanvasPrimitive>_>_>_>
  position;
  shared_ptr<editor::figures::CanvasPrimitive> *primitive_local;
  GraphicDocument *this_local;
  
  position._M_current = primitive;
  local_28._M_current =
       (shared_ptr<editor::figures::CanvasPrimitive> *)
       std::
       vector<std::shared_ptr<editor::figures::CanvasPrimitive>,_std::allocator<std::shared_ptr<editor::figures::CanvasPrimitive>_>_>
       ::begin(&this->elements);
  local_30 = (shared_ptr<editor::figures::CanvasPrimitive> *)
             std::
             vector<std::shared_ptr<editor::figures::CanvasPrimitive>,_std::allocator<std::shared_ptr<editor::figures::CanvasPrimitive>_>_>
             ::end(&this->elements);
  local_20 = std::
             find<__gnu_cxx::__normal_iterator<std::shared_ptr<editor::figures::CanvasPrimitive>*,std::vector<std::shared_ptr<editor::figures::CanvasPrimitive>,std::allocator<std::shared_ptr<editor::figures::CanvasPrimitive>>>>,std::shared_ptr<editor::figures::CanvasPrimitive>>
                       (local_28,(__normal_iterator<std::shared_ptr<editor::figures::CanvasPrimitive>_*,_std::vector<std::shared_ptr<editor::figures::CanvasPrimitive>,_std::allocator<std::shared_ptr<editor::figures::CanvasPrimitive>_>_>_>
                                  )local_30,position._M_current);
  local_38._M_current =
       (shared_ptr<editor::figures::CanvasPrimitive> *)
       std::
       vector<std::shared_ptr<editor::figures::CanvasPrimitive>,_std::allocator<std::shared_ptr<editor::figures::CanvasPrimitive>_>_>
       ::end(&this->elements);
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_38);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"removing primitive ");
    peVar3 = std::
             __shared_ptr_access<editor::figures::CanvasPrimitive,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<editor::figures::CanvasPrimitive,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)position._M_current);
    (**peVar3->_vptr_CanvasPrimitive)();
    poVar2 = std::operator<<(poVar2,local_58);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string(local_58);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<editor::figures::CanvasPrimitive>const*,std::vector<std::shared_ptr<editor::figures::CanvasPrimitive>,std::allocator<std::shared_ptr<editor::figures::CanvasPrimitive>>>>
    ::__normal_iterator<std::shared_ptr<editor::figures::CanvasPrimitive>*>
              ((__normal_iterator<std::shared_ptr<editor::figures::CanvasPrimitive>const*,std::vector<std::shared_ptr<editor::figures::CanvasPrimitive>,std::allocator<std::shared_ptr<editor::figures::CanvasPrimitive>>>>
                *)&local_70,&local_20);
    std::
    vector<std::shared_ptr<editor::figures::CanvasPrimitive>,_std::allocator<std::shared_ptr<editor::figures::CanvasPrimitive>_>_>
    ::erase(&this->elements,local_70);
  }
  return;
}

Assistant:

void GraphicDocument::remove_primitive_from_document(std::shared_ptr<figures::CanvasPrimitive>& primitive) {
        auto position = std::find(elements.begin(), elements.end(), primitive);
        if (position != elements.end()) {
            std::cout << "removing primitive " << primitive->get_representation() << "\n";
            elements.erase(position);
        }
    }